

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmccntr_op_start(CPUARMState_conflict *env)

{
  _Bool _Var1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t overflow_mask;
  uint64_t new_pmccntr;
  uint64_t eff_cycles;
  uint64_t cycles;
  CPUARMState_conflict *env_local;
  
  uVar2 = cycles_get_count(env);
  _Var1 = pmu_counter_enabled(env,'\x1f');
  if (_Var1) {
    new_pmccntr = uVar2;
    if (((env->cp15).c9_pmcr & 8) != 0) {
      new_pmccntr = uVar2 >> 6;
    }
    uVar3 = new_pmccntr - (env->cp15).c15_ccnt_delta;
    uVar4 = 0x80000000;
    if (((env->cp15).c9_pmcr & 0x40) != 0) {
      uVar4 = 0x8000000000000000;
    }
    if (((env->cp15).c15_ccnt & (uVar3 ^ 0xffffffffffffffff) & uVar4) != 0) {
      (env->cp15).c9_pmovsr = (env->cp15).c9_pmovsr | 0xffffffff80000000;
    }
    (env->cp15).c15_ccnt = uVar3;
  }
  (env->cp15).c15_ccnt_delta = uVar2;
  return;
}

Assistant:

static void pmccntr_op_start(CPUARMState *env)
{
    uint64_t cycles = cycles_get_count(env);

    if (pmu_counter_enabled(env, 31)) {
        uint64_t eff_cycles = cycles;
        if (env->cp15.c9_pmcr & PMCRD) {
            /* Increment once every 64 processor clock cycles */
            eff_cycles /= 64;
        }

        uint64_t new_pmccntr = eff_cycles - env->cp15.c15_ccnt_delta;

        uint64_t overflow_mask = env->cp15.c9_pmcr & PMCRLC ? \
                                 1ull << 63 : 1ull << 31;
        if (env->cp15.c15_ccnt & ~new_pmccntr & overflow_mask) {
            env->cp15.c9_pmovsr |= (1 << 31);
        }

        env->cp15.c15_ccnt = new_pmccntr;
    }
    env->cp15.c15_ccnt_delta = cycles;
}